

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O0

char * log_msg_internal_1(CTcTokFileDesc *linedesc,long linenum,int *err_counter,int *warn_counter,
                         int *first_error,int *first_warning,unsigned_long options,
                         int *suppress_list,size_t suppress_cnt,tc_severity_t severity,int err)

{
  char *buf;
  int *in_RCX;
  int *in_RDX;
  undefined8 in_RSI;
  CTcTokFileDesc *in_RDI;
  char *in_R8;
  char *in_R9;
  ulong in_stack_00000008;
  char *dst;
  char *src;
  char qu_buf [8194];
  char *fname;
  int *p;
  size_t rem;
  char *prefix;
  char *msg;
  int in_stack_ffffffffffffdf78;
  int in_stack_ffffffffffffdf7c;
  char *local_2078;
  char *local_2070;
  char local_2068;
  char local_2067 [159];
  char *local_60;
  int *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  
  if ((qu_buf._0_4_ == 1) || (qu_buf._0_4_ == 2)) {
    local_58 = (int *)dst;
    for (local_50 = src; local_50 != (char *)0x0; local_50 = local_50 + -1) {
      if (*local_58 == qu_buf._8_4_) {
        return (char *)0x0;
      }
      local_58 = local_58 + 1;
    }
  }
  buf = (char *)(ulong)(uint)qu_buf._0_4_;
  switch(buf) {
  case (char *)0x0:
    local_48 = "";
    break;
  case (char *)0x1:
    if (((in_stack_00000008 & 8) == 0) || ((in_stack_00000008 & 4) == 0)) {
      return (char *)0x0;
    }
    if ((*in_RCX == 0) && (in_R9 != (char *)0x0)) {
      *(undefined4 *)in_R9 = qu_buf._8_4_;
    }
    *in_RCX = *in_RCX + 1;
    local_48 = "warning";
    break;
  case (char *)0x2:
    if ((in_stack_00000008 & 4) == 0) {
      return (char *)0x0;
    }
    if ((*in_RCX == 0) && (in_R9 != (char *)0x0)) {
      *(undefined4 *)in_R9 = qu_buf._8_4_;
    }
    *in_RCX = *in_RCX + 1;
    local_48 = "warning";
    break;
  case (char *)0x3:
    if ((*in_RDX == 0) && (in_R8 != (char *)0x0)) {
      *(undefined4 *)in_R8 = qu_buf._8_4_;
    }
    *in_RDX = *in_RDX + 1;
    local_48 = "error";
    break;
  case (char *)0x4:
    if ((*in_RDX == 0) && (in_R8 != (char *)0x0)) {
      *(undefined4 *)in_R8 = qu_buf._8_4_;
    }
    *in_RDX = *in_RDX + 1;
    local_48 = "fatal error";
    break;
  case (char *)0x5:
    if ((*in_RDX == 0) && (in_R8 != (char *)0x0)) {
      *(undefined4 *)in_R8 = qu_buf._8_4_;
    }
    *in_RDX = *in_RDX + 1;
    local_48 = "internal error";
  }
  if (in_RDI != (CTcTokFileDesc *)0x0) {
    local_60 = CTcTokFileDesc::get_fname(in_RDI);
    if ((in_stack_00000008 & 0x10) != 0) {
      local_60 = os_get_root_name(buf);
    }
    if ((in_stack_00000008 & 0x20) != 0) {
      local_2070 = local_60;
      local_2068 = '\"';
      local_2078 = local_2067;
      while (*local_2070 != '\0') {
        if (*local_2070 == '\"') {
          *local_2078 = '\"';
          local_2078 = local_2078 + 1;
        }
        *local_2078 = *local_2070;
        local_2078 = local_2078 + 1;
        local_2070 = local_2070 + 1;
      }
      *local_2078 = '\"';
      local_2078[1] = '\0';
      local_60 = &local_2068;
    }
    CTcHostIfc::print_err(G_hostifc,"%s(%ld): ",local_60,in_RSI);
  }
  CTcHostIfc::print_err(G_hostifc,"%s",local_48);
  if (((in_stack_00000008 & 2) != 0) && (qu_buf._0_4_ != 0)) {
    CTcHostIfc::print_err(G_hostifc," %u",(ulong)(uint)qu_buf._8_4_);
  }
  CTcHostIfc::print_err(G_hostifc,": ");
  local_40 = tcerr_get_msg(in_stack_ffffffffffffdf7c,in_stack_ffffffffffffdf78);
  if (local_40 == (char *)0x0) {
    local_40 = 
    "[Unable to find message text for this error code.  This might indicate an internal problem with the compiler, or it might be caused by an installation problem that is preventing the compiler from finding an external message file that it requires.]"
    ;
  }
  return local_40;
}

Assistant:

static const char *log_msg_internal_1(
    CTcTokFileDesc *linedesc, long linenum,
    int *err_counter, int *warn_counter, int *first_error, int *first_warning,
    unsigned long options, const int *suppress_list, size_t suppress_cnt,
    tc_severity_t severity, int err)
{
    const char *msg;
    const char *prefix;

    /*
     *   If this is a warning or a pedantic warning, and it's in the list of
     *   suppressed messages, ignore it entirely.  
     */
    if (severity == TC_SEV_PEDANTIC || severity == TC_SEV_WARNING)
    {
        size_t rem;
        const int *p;

        /* scan the suppress list */
        for (p = suppress_list, rem = suppress_cnt ; rem != 0 ; ++p, --rem)
        {
            /* check for a match */
            if (*p == err)
            {
                /* it's in the suppress list - ignore the error */
                return 0;
            }
        }
    }

    /* increment the appropriate counter */
    switch(severity)
    {
    case TC_SEV_INFO:
        /* 
         *   we don't need to count informational messages, and no prefix is
         *   required 
         */
        prefix = "";
        break;

    case TC_SEV_PEDANTIC:
        /* 
         *   if we're not in "pedantic" mode, or we're not even showing
         *   regular errors, ignore it 
         */
        if (!(options & TCMAIN_ERR_PEDANTIC)
            || !(options & TCMAIN_ERR_WARNINGS))
            return 0;

        /* if this is the first warning, remember the code */
        if (*warn_counter == 0 && first_warning != 0)
            *first_warning = err;

        /* count it */
        ++(*warn_counter);

        /* set the prefix */
        prefix = "warning";
        break;

    case TC_SEV_WARNING:
        /* if we're suppressing warnings, ignore it */
        if (!(options & TCMAIN_ERR_WARNINGS))
            return 0;

        /* if this is the first warning, remember the code */
        if (*warn_counter == 0 && first_warning != 0)
            *first_warning = err;

        /* count the warning */
        ++(*warn_counter);

        /* use an appropriate prefix */
        prefix = "warning";
        break;

    case TC_SEV_ERROR:
        /* if this is the first error, remember the code */
        if (*err_counter == 0 && first_error != 0)
            *first_error = err;

        /* count the error */
        ++(*err_counter);

        /* use an appropriate prefix */
        prefix = "error";
        break;

    case TC_SEV_FATAL:
        /* if this is the first error, remember the code */
        if (*err_counter == 0 && first_error != 0)
            *first_error = err;

        /* count this as an error */
        ++(*err_counter);

        /* use an appropriate prefix */
        prefix = "fatal error";
        break;

    case TC_SEV_INTERNAL:
        /* if this is the first error, remember the code */
        if (*err_counter == 0 && first_error != 0)
            *first_error = err;

        /* count this as an error */
        ++(*err_counter);

        /* use an appropriate prefix */
        prefix = "internal error";
        break;
    }

    /* display the current parsing position, if available */
    if (linedesc != 0)
    {
        const char *fname;
        char qu_buf[OSFNMAX*2 + 2];

        /* get the filename from the source descriptor */
        fname = linedesc->get_fname();

        /* 
         *   if we're in test reporting mode, show only the root part of the
         *   filename 
         */
        if ((options & TCMAIN_ERR_TESTMODE) != 0)
            fname = os_get_root_name((char *)fname);

        /* if they want quoted filenames, quote the filename */
        if ((options & TCMAIN_ERR_FNAME_QU) != 0)
        {
            const char *src;
            char *dst;

            /* quote each character of the filename */
            for (src = fname, qu_buf[0] = '"', dst = qu_buf + 1 ;
                 *src != '\0' ; )
            {
                /* if this is a quote character, stutter it */
                if (*src == '"')
                    *dst++ = '"';

                /* add this character */
                *dst++ = *src++;
            }

            /* add a closing quote and trailing null */
            *dst++ = '"';
            *dst = '\0';

            /* use the quoted version of the filename */
            fname = qu_buf;
        }

        /* show the filename and line number prefix */
        G_hostifc->print_err("%s(%ld): ", fname, linenum);
    }

    /* display the error type prefix */
    G_hostifc->print_err("%s", prefix);

    /* add the error number, if we're showing error numbers */
    if ((options & TCMAIN_ERR_NUMBERS) != 0 && severity != TC_SEV_INFO)
        G_hostifc->print_err(" %u", (unsigned int)err);

    /* add a colon and a space for separation */
    G_hostifc->print_err(": ");

    /* get the error message */
    msg = tcerr_get_msg(err, (options & TCMAIN_ERR_VERBOSE) != 0);
    if (msg == 0)
        msg = "[Unable to find message text for this error code.  "
              "This might indicate an internal problem with the compiler, "
              "or it might be caused by an installation problem that is "
              "preventing the compiler from finding an external message "
              "file that it requires.]";

    /* return the message text, so the caller can format it with arguments */
    return msg;
}